

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O0

frame * frame_from_string(frame *__return_storage_ptr__,string *s)

{
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  undefined8 local_28;
  long len;
  string *local_18;
  string *s_local;
  frame *result;
  
  len._7_1_ = 0;
  local_18 = s;
  s_local = &__return_storage_ptr__->addr;
  frame::frame(__return_storage_ptr__);
  local_28 = std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->crc,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::substr((ulong)local_78,(ulong)s);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::substr((ulong)local_98,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->func,local_98);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::substr((ulong)local_b8,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->data,local_b8);
  std::__cxx11::string::~string(local_b8);
  return __return_storage_ptr__;
}

Assistant:

frame frame_from_string(string s) {
	frame result;
	long len = s.size();
	result.crc = s.substr(len - 16, 16);
	result.addr = s.substr(0, 8);
	result.func = s.substr(8, 8);
	result.data = s.substr(16, len - 32);
	return result;
}